

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 HashmapCurrentValue(jx9_context *pCtx,jx9_hashmap *pMap,int iDirection)

{
  int iVar1;
  jx9_value *pValue;
  jx9_hashmap_node *pNode;
  
  pNode = pMap->pCur;
  if (pNode != (jx9_hashmap_node *)0x0) {
    if (iDirection != 0) {
      pNode = (&pNode->pNext)[0 < iDirection];
      pMap->pCur = pNode;
      if (pNode == (jx9_hashmap_node *)0x0) goto LAB_00132e8a;
    }
    pValue = HashmapExtractNodeValue(pNode);
    if (pValue != (jx9_value *)0x0) {
      iVar1 = jx9_result_value(pCtx,pValue);
      return iVar1;
    }
  }
LAB_00132e8a:
  iVar1 = jx9_result_bool(pCtx,0);
  return iVar1;
}

Assistant:

static sxi32 HashmapCurrentValue(jx9_context *pCtx, jx9_hashmap *pMap, int iDirection)
{
	jx9_hashmap_node *pCur = pMap->pCur;
	jx9_value *pVal;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( iDirection != 0 ){
		if( iDirection > 0 ){
			/* Point to the next entry */
			pMap->pCur = pCur->pPrev; /* Reverse link */
			pCur = pMap->pCur;
		}else{
			/* Point to the previous entry */
			pMap->pCur = pCur->pNext; /* Reverse link */
			pCur = pMap->pCur;
		}
		if( pCur == 0 ){
			/* End of input reached, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
	}		
	/* Point to the desired element */
	pVal = HashmapExtractNodeValue(pCur);
	if( pVal ){
		jx9_result_value(pCtx, pVal);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}